

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O2

void __thiscall tf::Taskflow::_dump(Taskflow *this,ostream *os,Graph *top)

{
  size_t sVar1;
  mapped_type *pmVar2;
  _Elt_pointer ppVar3;
  ostream *poVar4;
  pair<const_tf::Node_*,_const_tf::Graph_*> local_e8;
  string *local_d0;
  Graph *top_local;
  Dumper dumper;
  
  top_local = top;
  Dumper::Dumper(&dumper);
  dumper.id = 0;
  local_e8.first = (Node *)0x0;
  local_e8.second = top;
  std::
  deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
  ::emplace_back<std::pair<tf::Node_const*,tf::Graph_const*>>
            ((deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
              *)&dumper.stack,&local_e8);
  sVar1 = dumper.id;
  dumper.id = dumper.id + 1;
  pmVar2 = std::__detail::
           _Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&dumper.visited,&top_local);
  *pmVar2 = sVar1;
  local_d0 = (string *)&this->_name;
  while (dumper.stack.c.
         super__Deque_base<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         dumper.stack.c.
         super__Deque_base<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    ppVar3 = dumper.stack.c.
             super__Deque_base<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (dumper.stack.c.
        super__Deque_base<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        dumper.stack.c.
        super__Deque_base<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar3 = dumper.stack.c.
               super__Deque_base<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    local_e8.first = ppVar3[-1].first;
    local_e8.second = ppVar3[-1].second;
    std::
    deque<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>
    ::pop_back(&dumper.stack.c);
    poVar4 = std::operator<<(os,"subgraph cluster_p");
    poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
    std::operator<<(poVar4," {\nlabel=\"");
    if (local_e8.first == (Node *)0x0) {
      std::operator<<(os,"Taskflow: ");
      if ((this->_name)._M_string_length == 0) {
        poVar4 = std::operator<<(os,'p');
        std::ostream::_M_insert<void_const*>(poVar4);
      }
      else {
        std::operator<<(os,local_d0);
      }
    }
    else {
      poVar4 = std::operator<<(os,'m');
      std::__detail::
      _Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&dumper.visited,&local_e8.second);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    }
    std::operator<<(os,"\";\n");
    _dump(this,os,local_e8.second,&dumper);
    std::operator<<(os,"}\n");
  }
  Dumper::~Dumper(&dumper);
  return;
}

Assistant:

inline void Taskflow::_dump(std::ostream& os, const Graph* top) const {

  Dumper dumper;

  dumper.id = 0;
  dumper.stack.push({nullptr, top});
  dumper.visited[top] = dumper.id++;

  while(!dumper.stack.empty()) {

    auto [p, f] = dumper.stack.top();
    dumper.stack.pop();

    os << "subgraph cluster_p" << f << " {\nlabel=\"";

    // n-level module
    if(p) {
      os << 'm' << dumper.visited[f];
    }
    // top-level taskflow graph
    else {
      os << "Taskflow: ";
      if(_name.empty()) os << 'p' << this;
      else os << _name;
    }

    os << "\";\n";

    _dump(os, f, dumper);
    os << "}\n";
  }
}